

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O2

void __thiscall
pbrt::HaltonSampler::HaltonSampler
          (HaltonSampler *this,int samplesPerPixel,Point2i *fullRes,
          RandomizeStrategy randomizeStrategy,int seed,Allocator alloc)

{
  int iVar1;
  ulong uVar2;
  int i;
  int iVar3;
  vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_> *pvVar4;
  uint64_t uVar5;
  int iVar6;
  int iVar7;
  
  this->samplesPerPixel = samplesPerPixel;
  this->randomizeStrategy = randomizeStrategy;
  this->haltonIndex = 0;
  this->dimension = 0;
  (this->baseExponents).super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)0x0;
  this->digitPermutations =
       (vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_> *)
       0x0;
  (this->baseScales).super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)0x0;
  if (randomizeStrategy == PermuteDigits) {
    pvVar4 = ComputeRadicalInversePermutations(seed,alloc);
    this->digitPermutations = pvVar4;
  }
  for (iVar3 = 0; iVar3 != 2; iVar3 = iVar3 + 1) {
    iVar7 = 1;
    uVar2 = (ulong)(iVar3 != 0);
    iVar1 = (&(fullRes->super_Tuple2<pbrt::Point2,_int>).x)[uVar2];
    if (0x7f < iVar1) {
      iVar1 = 0x80;
    }
    iVar6 = 0;
    for (; iVar7 < iVar1; iVar7 = iVar7 * (iVar3 == 0 ^ 3)) {
      iVar6 = iVar6 + 1;
    }
    this->multInverse[uVar2 - 4] = iVar7;
    this->multInverse[uVar2 - 2] = iVar6;
  }
  uVar5 = multiplicativeInverse
                    ((long)(this->baseScales).super_Tuple2<pbrt::Point2,_int>.y,
                     (long)(this->baseScales).super_Tuple2<pbrt::Point2,_int>.x);
  this->multInverse[0] = (int)uVar5;
  uVar5 = multiplicativeInverse
                    ((long)(this->baseScales).super_Tuple2<pbrt::Point2,_int>.x,
                     (long)(this->baseScales).super_Tuple2<pbrt::Point2,_int>.y);
  this->multInverse[1] = (int)uVar5;
  return;
}

Assistant:

HaltonSampler::HaltonSampler(int samplesPerPixel, const Point2i &fullRes,
                             RandomizeStrategy randomizeStrategy, int seed,
                             Allocator alloc)
    : samplesPerPixel(samplesPerPixel), randomizeStrategy(randomizeStrategy) {
    if (randomizeStrategy == RandomizeStrategy::PermuteDigits)
        digitPermutations = ComputeRadicalInversePermutations(seed, alloc);
    // Find radical inverse base scales and exponents that cover sampling area
    for (int i = 0; i < 2; ++i) {
        int base = (i == 0) ? 2 : 3;
        int scale = 1, exp = 0;
        while (scale < std::min(fullRes[i], MaxHaltonResolution)) {
            scale *= base;
            ++exp;
        }
        baseScales[i] = scale;
        baseExponents[i] = exp;
    }

    // Compute multiplicative inverses for _baseScales_
    multInverse[0] = multiplicativeInverse(baseScales[1], baseScales[0]);
    multInverse[1] = multiplicativeInverse(baseScales[0], baseScales[1]);
}